

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                    *other)

{
  ostream *poVar1;
  ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
  local_41;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
  local_3f;
  string local_38 [32];
  
  poVar1 = std::operator<<(stream,"[");
  poVar1 = operator<<(poVar1,&local_3f);
  op_plus<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = operator<<(poVar1,&local_41);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_38);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }